

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

int __thiscall
curlpp::CallbackException<curlpp::UnknowException>::clone
          (CallbackException<curlpp::UnknowException> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  CallbackException<curlpp::UnknowException> *this_00;
  
  this_00 = (CallbackException<curlpp::UnknowException> *)operator_new(0x20);
  CallbackException(this_00,this);
  return (int)this_00;
}

Assistant:

virtual _CE * clone() 
		{
			return new _CE(*this);
		}